

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O1

float GD::compute_update<true,false,true,false,true,0ul,1ul,2ul>(gd *g,example *ec)

{
  uint uVar1;
  float fVar2;
  vw *pvVar3;
  shared_data *psVar4;
  float extraout_XMM0_Da;
  float fVar5;
  float fVar6;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  double dVar7;
  double dVar8;
  float fVar9;
  
  pvVar3 = g->all;
  uVar1 = (ec->l).multi.label;
  ec->updated_prediction = (float)(ec->pred).multiclass;
  (*pvVar3->loss->_vptr_loss_function[1])
            ((ulong)(ec->pred).multiclass,(ulong)uVar1,pvVar3->loss,pvVar3->sd);
  fVar9 = 0.0;
  if (0.0 < extraout_XMM0_Da) {
    fVar5 = get_pred_per_update<true,false,true,0ul,1ul,2ul,false>(g,ec);
    fVar9 = ec->weight;
    fVar2 = g->all->eta;
    psVar4 = g->all->sd;
    fVar6 = powf((float)(((double)fVar9 + psVar4->t) - psVar4->weighted_holdout_examples),
                 g->neg_power_t);
    (*pvVar3->loss->_vptr_loss_function[3])
              ((ulong)(ec->pred).multiclass,(ulong)(ec->l).multi.label,
               (ulong)(uint)(fVar9 * fVar2 * fVar6));
    ec->updated_prediction = fVar5 * extraout_XMM0_Da_00 + ec->updated_prediction;
    fVar9 = extraout_XMM0_Da_00;
    if ((pvVar3->reg_mode != 0) && (1e-08 < ABS(extraout_XMM0_Da_00))) {
      (*pvVar3->loss->_vptr_loss_function[6])
                ((ulong)(ec->pred).multiclass,(ulong)(ec->l).multi.label,pvVar3->loss,pvVar3->sd);
      dVar8 = ABS((double)extraout_XMM0_Da_01);
      dVar7 = (double)(-(ulong)(1e-08 < dVar8) &
                      (ulong)((double)-extraout_XMM0_Da_00 / (double)extraout_XMM0_Da_01));
      if (1e-08 < dVar8) {
        pvVar3->sd->contraction =
             (1.0 - (double)pvVar3->l2_lambda * dVar7) * pvVar3->sd->contraction;
      }
      psVar4 = pvVar3->sd;
      fVar9 = extraout_XMM0_Da_00 / (float)psVar4->contraction;
      psVar4->gravity = dVar7 * (double)pvVar3->l1_lambda + psVar4->gravity;
    }
  }
  return fVar9 - g->sparse_l2 * (ec->pred).scalar;
}

Assistant:

float compute_update(gd& g, example& ec)
{
  // invariant: not a test label, importance weight > 0
  label_data& ld = ec.l.simple;
  vw& all = *g.all;

  float update = 0.;
  ec.updated_prediction = ec.pred.scalar;
  if (all.loss->getLoss(all.sd, ec.pred.scalar, ld.label) > 0.)
  {
    float pred_per_update = sensitivity<sqrt_rate, feature_mask_off, adax, adaptive, normalized, spare, false>(g, ec);
    float update_scale = get_scale<adaptive>(g, ec, ec.weight);
    if (invariant)
      update = all.loss->getUpdate(ec.pred.scalar, ld.label, update_scale, pred_per_update);
    else
      update = all.loss->getUnsafeUpdate(ec.pred.scalar, ld.label, update_scale);
    // changed from ec.partial_prediction to ld.prediction
    ec.updated_prediction += pred_per_update * update;

    if (all.reg_mode && fabs(update) > 1e-8)
    {
      double dev1 = all.loss->first_derivative(all.sd, ec.pred.scalar, ld.label);
      double eta_bar = (fabs(dev1) > 1e-8) ? (-update / dev1) : 0.0;
      if (fabs(dev1) > 1e-8)
        all.sd->contraction *= (1. - all.l2_lambda * eta_bar);
      update /= (float)all.sd->contraction;
      all.sd->gravity += eta_bar * all.l1_lambda;
    }
  }

  if (sparse_l2)
    update -= g.sparse_l2 * ec.pred.scalar;

  return update;
}